

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O2

void __thiscall nvtt::InputOptions::Private::computeTargetExtents(Private *this)

{
  uint uVar1;
  RoundMode RVar2;
  InputImage *pIVar3;
  int iVar4;
  uint uVar5;
  uint v;
  uint v_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if ((this->images == (InputImage *)0x0) &&
     (iVar4 = nvAbort("images != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/InputOptions.cpp"
                      ,0x142,"void nvtt::InputOptions::Private::computeTargetExtents() const"),
     iVar4 == 1)) {
    raise(5);
  }
  uVar5 = this->maxExtent;
  if (this->roundMode != RoundMode_None) {
    uVar5 = anon_unknown.dwarf_4d146b::previousPowerOfTwo(uVar5);
  }
  pIVar3 = this->images;
  v = pIVar3->width;
  v_00 = pIVar3->height;
  uVar1 = pIVar3->depth;
  uVar6 = v_00;
  if (v_00 < v) {
    uVar6 = v;
  }
  if (uVar6 <= uVar1) {
    uVar6 = uVar1;
  }
  uVar8 = uVar1;
  if ((uVar5 != 0) && (uVar5 < uVar6)) {
    uVar8 = v * uVar5;
    uVar7 = 1;
    v = uVar8 / uVar6;
    if (uVar8 < uVar6) {
      v = uVar7;
    }
    uVar8 = v_00 * uVar5;
    v_00 = uVar8 / uVar6;
    if (uVar8 < uVar6) {
      v_00 = uVar7;
    }
    uVar8 = (uVar1 * uVar5) / uVar6;
    if (uVar1 * uVar5 < uVar6) {
      uVar8 = uVar7;
    }
  }
  RVar2 = this->roundMode;
  if (RVar2 == RoundMode_ToPreviousPowerOfTwo) {
    v = anon_unknown.dwarf_4d146b::previousPowerOfTwo(v);
    v_00 = anon_unknown.dwarf_4d146b::previousPowerOfTwo(v_00);
    uVar8 = anon_unknown.dwarf_4d146b::previousPowerOfTwo(uVar8);
  }
  else if (RVar2 == RoundMode_ToNearestPowerOfTwo) {
    v = anon_unknown.dwarf_4d146b::nearestPowerOfTwo(v);
    v_00 = anon_unknown.dwarf_4d146b::nearestPowerOfTwo(v_00);
    uVar8 = anon_unknown.dwarf_4d146b::nearestPowerOfTwo(uVar8);
  }
  else if (RVar2 == RoundMode_ToNextPowerOfTwo) {
    v = nv::nextPowerOfTwo(v);
    v_00 = nv::nextPowerOfTwo(v_00);
    uVar8 = nv::nextPowerOfTwo(uVar8);
  }
  this->targetWidth = v;
  this->targetHeight = v_00;
  this->targetDepth = uVar8;
  uVar5 = anon_unknown.dwarf_4d146b::countMipmaps(v,v_00,uVar8);
  this->targetMipmapCount = uVar5;
  return;
}

Assistant:

void InputOptions::Private::computeTargetExtents() const
{
	nvCheck(images != NULL);
	
	uint maxExtent = this->maxExtent;
	if (roundMode != RoundMode_None)
	{
		// rounded max extent should never be higher than original max extent.
		maxExtent = previousPowerOfTwo(maxExtent);
	}

	uint w = images->width;
	uint h = images->height;
	uint d = images->depth;
	
	nvDebugCheck(w > 0);
	nvDebugCheck(h > 0);
	nvDebugCheck(d > 0);
	
	// Scale extents without changing aspect ratio.
	uint maxwhd = max(max(w, h), d);
	if (maxExtent != 0 && maxwhd > maxExtent)
	{
		w = max((w * maxExtent) / maxwhd, 1U);
		h = max((h * maxExtent) / maxwhd, 1U);
		d = max((d * maxExtent) / maxwhd, 1U);
	}
	
	// Round to power of two.
	if (roundMode == RoundMode_ToNextPowerOfTwo)
	{
		w = nextPowerOfTwo(w);
		h = nextPowerOfTwo(h);
		d = nextPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToNearestPowerOfTwo)
	{
		w = nearestPowerOfTwo(w);
		h = nearestPowerOfTwo(h);
		d = nearestPowerOfTwo(d);
	}
	else if (roundMode == RoundMode_ToPreviousPowerOfTwo)
	{
		w = previousPowerOfTwo(w);
		h = previousPowerOfTwo(h);
		d = previousPowerOfTwo(d);
	}
	
	this->targetWidth = w;
	this->targetHeight = h;
	this->targetDepth = d;
	
	this->targetMipmapCount = countMipmaps(w, h, d);
}